

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar1;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pdVar6 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar6 = (pFVar3->dx_).ptr_to_data + i;
  }
  pFVar3 = (pFVar2->fadexpr_).right_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  pFVar3 = (this->right_->fadexpr_).right_;
  pdVar5 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar5 = (pFVar3->dx_).ptr_to_data + i;
  }
  return *pdVar5 * (this->right_->fadexpr_).left_.constant_ +
         *pdVar4 * (pFVar2->fadexpr_).left_.constant_ + *pdVar6 * (pFVar1->fadexpr_).left_.constant_
  ;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}